

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O0

GlyphMetrics * __thiscall
FtFontRenderer::getGlyphMetrics
          (GlyphMetrics *__return_storage_ptr__,FtFontRenderer *this,GlyphIndex glyphIdx)

{
  char32_t cp;
  FontRendererError *this_00;
  char *pcVar1;
  undefined8 uVar2;
  long lVar3;
  long local_90;
  FT_BBox bbox;
  undefined1 local_68 [48];
  string local_38 [32];
  int local_18;
  GlyphIndex local_14;
  FT_Error err;
  GlyphIndex glyphIdx_local;
  FtFontRenderer *this_local;
  
  local_14 = glyphIdx;
  _err = this;
  local_18 = FT_Load_Glyph(this->face,glyphIdx,this->loadFlags);
  if (local_18 != 0) {
    bbox.yMax._7_1_ = 1;
    this_00 = (FontRendererError *)__cxa_allocate_exception(0x10);
    cp = idxToCp(this->face,local_14);
    pcVar1 = dpfb::unicode::cpToStr(cp);
    ftErrorToStr_abi_cxx11_((FT_Error)local_68);
    uVar2 = std::__cxx11::string::c_str();
    dpfb::str::format_abi_cxx11_((char *)local_38,"Can\'t load glyph for %s: %s",pcVar1,uVar2);
    dpfb::FontRendererError::runtime_error(this_00,local_38);
    bbox.yMax._7_1_ = 0;
    __cxa_throw(this_00,&dpfb::FontRendererError::typeinfo,
                dpfb::FontRendererError::~FontRendererError);
  }
  dpfb::GlyphMetrics::GlyphMetrics(__return_storage_ptr__);
  __return_storage_ptr__->advance = (int)((this->face->glyph->advance).x >> 6);
  if (this->face->glyph->format == FT_GLYPH_FORMAT_BITMAP) {
    (__return_storage_ptr__->size).w = (this->face->glyph->bitmap).width;
    (__return_storage_ptr__->size).h = (this->face->glyph->bitmap).rows;
    (__return_storage_ptr__->offset).x = this->face->glyph->bitmap_left;
    (__return_storage_ptr__->offset).y = this->face->glyph->bitmap_top;
  }
  else {
    FT_Outline_Get_CBox(&this->face->glyph->outline,&local_90);
    local_90 = ftFoor<long>(local_90);
    bbox.yMin = ftCeil<long>(bbox.yMin);
    bbox.xMin = ftFoor<long>(bbox.xMin);
    lVar3 = ftCeil<long>(bbox.xMax);
    (__return_storage_ptr__->size).w = (int)(bbox.yMin - local_90 >> 6);
    (__return_storage_ptr__->size).h = (int)(lVar3 - bbox.xMin >> 6);
    (__return_storage_ptr__->offset).x = (int)(local_90 >> 6);
    (__return_storage_ptr__->offset).y = (int)(lVar3 >> 6);
  }
  return __return_storage_ptr__;
}

Assistant:

dpfb::GlyphMetrics FtFontRenderer::getGlyphMetrics(
    dpfb::GlyphIndex glyphIdx) const
{
    auto err = FT_Load_Glyph(face, glyphIdx, loadFlags);
    if (err != FT_Err_Ok)
        throw dpfb::FontRendererError(
            dpfb::str::format(
                "Can't load glyph for %s: %s",
                dpfb::unicode::cpToStr(idxToCp(face, glyphIdx)),
                ftErrorToStr(err).c_str()));

    dpfb::GlyphMetrics glyphMetrics;
    glyphMetrics.advance = face->glyph->advance.x >> 6;

    if (face->glyph->format == FT_GLYPH_FORMAT_BITMAP) {
        // Embedded bitmap
        glyphMetrics.size.w = static_cast<int>(face->glyph->bitmap.width);
        glyphMetrics.size.h = static_cast<int>(face->glyph->bitmap.rows);
        glyphMetrics.offset.x = face->glyph->bitmap_left;
        glyphMetrics.offset.y = face->glyph->bitmap_top;
    } else {
        FT_BBox bbox;
        FT_Outline_Get_CBox(&face->glyph->outline, &bbox);

        // See:
        //  FreeType Glyph Conventions
        //      VI. FreeType outlines
        //          3. Coordinates, scaling and grid-fitting
        // https://www.freetype.org/freetype2/docs/glyphs/glyphs-6.html

        bbox.xMin = ftFoor(bbox.xMin);
        bbox.xMax = ftCeil(bbox.xMax);
        bbox.yMin = ftFoor(bbox.yMin);
        bbox.yMax = ftCeil(bbox.yMax);

        glyphMetrics.size.w = (bbox.xMax - bbox.xMin) >> 6;
        glyphMetrics.size.h = (bbox.yMax - bbox.yMin) >> 6;
        glyphMetrics.offset.x = bbox.xMin >> 6;
        glyphMetrics.offset.y = bbox.yMax >> 6;
    }

    return glyphMetrics;
}